

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O0

void av1_estimate_block_intra
               (int plane,int block,int row,int col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,void *arg
               )

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int in_ECX;
  int in_EDX;
  int in_EDI;
  byte in_R8B;
  undefined1 in_R9B;
  undefined8 *in_stack_00000008;
  RD_STATS this_rdc;
  uint sad_threshold;
  uint this_sad;
  int64_t dst_stride;
  int64_t src_stride;
  uint8_t *dst_buf_base;
  uint8_t *src_buf_base;
  BLOCK_SIZE bsize_tx;
  macroblockd_plane *pd;
  macroblock_plane *p;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  AV1_COMP *cpi;
  estimate_block_intra_args *args;
  TX_SIZE in_stack_00000c5e;
  BLOCK_SIZE in_stack_00000c5f;
  int *in_stack_00000c60;
  RD_STATS *in_stack_00000c68;
  MACROBLOCK *in_stack_00000c70;
  uint local_bc;
  int local_a8;
  int in_stack_ffffffffffffff5c;
  RD_STATS *in_stack_ffffffffffffff60;
  MACROBLOCKD *in_stack_ffffffffffffff68;
  MACROBLOCK *in_stack_ffffffffffffff70;
  BLOCK_SIZE in_stack_ffffffffffffff7f;
  uint in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  long *plVar7;
  undefined8 *puVar8;
  undefined6 in_stack_ffffffffffffffe8;
  
  plVar7 = (long *)*in_stack_00000008;
  lVar4 = in_stack_00000008[1] + (long)in_EDI * 0x88;
  lVar5 = in_stack_00000008[1] + 0x1b0 + (long)in_EDI * 0xa30;
  lVar2 = *(long *)(lVar4 + 0x30);
  lVar3 = *(long *)(lVar5 + 0x10);
  lVar6 = (long)*(int *)(lVar4 + 0x48);
  iVar1 = *(int *)(lVar5 + 0x28);
  av1_predict_intra_block_facade
            ((AV1_COMMON *)CONCAT44(in_EDX,in_ECX),
             (MACROBLOCKD *)CONCAT17(in_R8B,CONCAT16(in_R9B,in_stack_ffffffffffffffe8)),
             (int)((ulong)in_stack_00000008 >> 0x20),(int)in_stack_00000008,
             (int)((ulong)plVar7 >> 0x20),(TX_SIZE)((ulong)plVar7 >> 0x18));
  if (((*(byte *)((long)in_stack_00000008 + 0x24) & 1) != 0) ||
     (puVar8 = in_stack_00000008, (*(byte *)((long)in_stack_00000008 + 0x25) & 1) != 0)) {
    in_stack_ffffffffffffff84 =
         (**(code **)(*plVar7 + 0xc900 + (ulong)in_R8B * 0x70))
                   (*(undefined8 *)(lVar4 + 0x30),*(undefined4 *)(lVar4 + 0x48),
                    *(undefined8 *)(lVar5 + 0x10),*(undefined4 *)(lVar5 + 0x28));
    if (*(int *)(in_stack_00000008 + 4) == -1) {
      local_bc = 0xffffffff;
    }
    else {
      local_bc = *(int *)(in_stack_00000008 + 4) + (*(uint *)(in_stack_00000008 + 4) >> 4);
    }
    if (((*(byte *)((long)in_stack_00000008 + 0x24) & 1) != 0) &&
       (local_bc < in_stack_ffffffffffffff84)) {
      *(undefined4 *)in_stack_00000008[3] = 0x7fffffff;
      *(undefined8 *)(in_stack_00000008[3] + 8) = 0x7fffffffffffffff;
      return;
    }
    in_stack_ffffffffffffff80 = local_bc;
    puVar8 = in_stack_00000008;
    if (in_stack_ffffffffffffff84 < *(uint *)(in_stack_00000008 + 4)) {
      *(uint *)(in_stack_00000008 + 4) = in_stack_ffffffffffffff84;
    }
  }
  av1_invalid_rd_stats((RD_STATS *)&local_a8);
  *(long *)(lVar4 + 0x30) = lVar2 + (in_EDX * lVar6 + (long)in_ECX) * 4;
  *(long *)(lVar5 + 0x10) = lVar3 + ((long)in_EDX * (long)iVar1 + (long)in_ECX) * 4;
  if (in_EDI == 0) {
    av1_block_yrd(in_stack_00000c70,in_stack_00000c68,in_stack_00000c60,in_stack_00000c5f,
                  in_stack_00000c5e);
  }
  else {
    av1_model_rd_for_sb_uv
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7f,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(int)lVar6);
  }
  *(long *)(lVar4 + 0x30) = lVar2;
  *(long *)(lVar5 + 0x10) = lVar3;
  *(int *)puVar8[3] = local_a8 + *(int *)puVar8[3];
  *(long *)(puVar8[3] + 8) = (long)&in_stack_ffffffffffffff60->rate + *(long *)(puVar8[3] + 8);
  return;
}

Assistant:

void av1_estimate_block_intra(int plane, int block, int row, int col,
                              BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                              void *arg) {
  struct estimate_block_intra_args *const args = arg;
  AV1_COMP *const cpi = args->cpi;
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *const p = &x->plane[plane];
  struct macroblockd_plane *const pd = &xd->plane[plane];
  const BLOCK_SIZE bsize_tx = txsize_to_bsize[tx_size];
  uint8_t *const src_buf_base = p->src.buf;
  uint8_t *const dst_buf_base = pd->dst.buf;
  const int64_t src_stride = p->src.stride;
  const int64_t dst_stride = pd->dst.stride;

  (void)block;

  av1_predict_intra_block_facade(cm, xd, plane, col, row, tx_size);

  if (args->prune_mode_based_on_sad || args->prune_palette_sad) {
    unsigned int this_sad = cpi->ppi->fn_ptr[plane_bsize].sdf(
        p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride);
    const unsigned int sad_threshold =
        args->best_sad != UINT_MAX ? args->best_sad + (args->best_sad >> 4)
                                   : UINT_MAX;
    // Skip the evaluation of current mode if its SAD is more than a threshold.
    if (args->prune_mode_based_on_sad && this_sad > sad_threshold) {
      // For the current mode, set rate and distortion to maximum possible
      // values and return.
      // Note: args->rdc->rate is checked in av1_nonrd_pick_intra_mode() to skip
      // the evaluation of the current mode.
      args->rdc->rate = INT_MAX;
      args->rdc->dist = INT64_MAX;
      return;
    }
    if (this_sad < args->best_sad) {
      args->best_sad = this_sad;
    }
  }

  RD_STATS this_rdc;
  av1_invalid_rd_stats(&this_rdc);

  p->src.buf = &src_buf_base[4 * (row * src_stride + col)];
  pd->dst.buf = &dst_buf_base[4 * (row * dst_stride + col)];

  if (plane == 0) {
    av1_block_yrd(x, &this_rdc, &args->skippable, bsize_tx,
                  AOMMIN(tx_size, TX_16X16));
  } else {
    av1_model_rd_for_sb_uv(cpi, bsize_tx, x, xd, &this_rdc, plane, plane);
  }

  p->src.buf = src_buf_base;
  pd->dst.buf = dst_buf_base;
  assert(args->rdc->rate != INT_MAX && args->rdc->dist != INT64_MAX);
  args->rdc->rate += this_rdc.rate;
  args->rdc->dist += this_rdc.dist;
}